

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_param_register_exception_tests_decl.cpp
# Opt level: O0

string * iutest::detail::MakeIndexTypedTestName<exception_value>
                   (string *__return_storage_ptr__,char *basename,size_t index)

{
  bool bVar1;
  undefined4 *puVar2;
  size_t in_RCX;
  size_t index_local;
  char *basename_local;
  
  if (((is_throw & 1) != 0) && (bVar1 = AlwaysTrue(), bVar1)) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0x2a;
    __cxa_throw(puVar2,&int::typeinfo,0);
  }
  MakeIndexTestName_abi_cxx11_(__return_storage_ptr__,(detail *)basename,(char *)index,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

::std::string MakeIndexTypedTestName<exception_value>(const char* basename, size_t index)
{
    if( is_throw )
    {
#if REGISTER_EXCEPTION_TEST_THROW_INT
        IUTEST_SUPPRESS_UNREACHABLE_CODE_WARNING(throw 42);
#else
        IUTEST_SUPPRESS_UNREACHABLE_CODE_WARNING(throw ::std::runtime_error("HOGE"));
#endif
    }
    return MakeIndexTestName(basename, index);
}